

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  bool bVar22;
  uint uVar23;
  undefined4 uVar24;
  ulong uVar25;
  ulong uVar26;
  _func_int **pp_Var27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong *puVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM0 [64];
  uint uVar40;
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 ai_1;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 ai_3;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 bi;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 bi_3;
  undefined1 auVar54 [16];
  vint4 ai_2;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 bi_2;
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  vint<4> mask;
  vint4 bi_8;
  vint<4> octant;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  AccelData *local_2708;
  ulong local_2700;
  RayHitK<4> *local_26f8;
  RayQueryContext *local_26f0;
  long local_26e8;
  long local_26e0;
  ulong local_26d8;
  ulong local_26d0;
  ulong local_26c8;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float local_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  undefined1 local_2690 [16];
  RTCIntersectFunctionNArguments local_2680;
  Geometry *local_2650;
  undefined8 local_2648;
  RTCIntersectArguments *local_2640;
  undefined4 local_2620;
  undefined4 uStack_261c;
  undefined4 uStack_2618;
  undefined4 uStack_2614;
  undefined4 uStack_2610;
  undefined4 uStack_260c;
  undefined4 uStack_2608;
  undefined4 uStack_2604;
  undefined4 local_2600;
  undefined4 uStack_25fc;
  undefined4 uStack_25f8;
  undefined4 uStack_25f4;
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  float local_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float local_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  uint local_2560;
  uint uStack_255c;
  uint uStack_2558;
  uint uStack_2554;
  uint uStack_2550;
  uint uStack_254c;
  uint uStack_2548;
  uint uStack_2544;
  undefined4 local_2540;
  undefined4 uStack_253c;
  undefined4 uStack_2538;
  undefined4 uStack_2534;
  undefined4 uStack_2530;
  undefined4 uStack_252c;
  undefined4 uStack_2528;
  undefined4 uStack_2524;
  uint local_2520;
  uint uStack_251c;
  uint uStack_2518;
  uint uStack_2514;
  uint uStack_2510;
  uint uStack_250c;
  uint uStack_2508;
  uint uStack_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  uint local_2460;
  uint uStack_245c;
  uint uStack_2458;
  uint uStack_2454;
  uint uStack_2450;
  uint uStack_244c;
  uint uStack_2448;
  uint uStack_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  uint local_2420;
  uint uStack_241c;
  uint uStack_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar37 [64];
  
  auVar43 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar35 = vpcmpeqd_avx(auVar43,(undefined1  [16])valid_i->field_0);
  uVar23 = vmovmskps_avx(auVar35);
  if (uVar23 == 0) {
    return;
  }
  local_2708 = This->ptr;
  local_2700 = (ulong)(uVar23 & 0xff);
  auVar56 = *(undefined1 (*) [16])(ray + 0x40);
  auVar44._8_4_ = 0x7fffffff;
  auVar44._0_8_ = 0x7fffffff7fffffff;
  auVar44._12_4_ = 0x7fffffff;
  auVar45 = vandps_avx(auVar56,auVar44);
  auVar50._8_4_ = 0x219392ef;
  auVar50._0_8_ = 0x219392ef219392ef;
  auVar50._12_4_ = 0x219392ef;
  auVar45 = vcmpps_avx(auVar45,auVar50,1);
  auVar47 = vblendvps_avx(auVar56,auVar50,auVar45);
  auVar45 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar44);
  auVar45 = vcmpps_avx(auVar45,auVar50,1);
  auVar52 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar50,auVar45);
  auVar45 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar44);
  auVar45 = vcmpps_avx(auVar45,auVar50,1);
  auVar45 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar50,auVar45);
  auVar44 = vrcpps_avx(auVar47);
  auVar51._8_4_ = 0x3f800000;
  auVar51._0_8_ = &DAT_3f8000003f800000;
  auVar51._12_4_ = 0x3f800000;
  auVar47 = vfnmadd213ps_fma(auVar47,auVar44,auVar51);
  local_2580 = vfmadd132ps_fma(auVar47,auVar44,auVar44);
  auVar60 = ZEXT1664(local_2580);
  auVar47 = vrcpps_avx(auVar52);
  auVar52 = vfnmadd213ps_fma(auVar52,auVar47,auVar51);
  local_2590 = vfmadd132ps_fma(auVar52,auVar47,auVar47);
  auVar61 = ZEXT1664(local_2590);
  auVar47 = vrcpps_avx(auVar45);
  auVar45 = vfnmadd213ps_fma(auVar45,auVar47,auVar51);
  local_25a0 = vfmadd132ps_fma(auVar45,auVar47,auVar47);
  auVar62 = ZEXT1664(local_25a0);
  auVar47 = ZEXT816(0) << 0x20;
  local_25e0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar47);
  local_25f0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar47);
  auVar56 = vcmpps_avx(auVar56,auVar47,1);
  auVar45._8_4_ = 1;
  auVar45._0_8_ = 0x100000001;
  auVar45._12_4_ = 1;
  auVar56 = vandps_avx(auVar56,auVar45);
  auVar45 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar47,1);
  auVar52._8_4_ = 2;
  auVar52._0_8_ = 0x200000002;
  auVar52._12_4_ = 2;
  auVar45 = vandps_avx(auVar45,auVar52);
  auVar45 = vorps_avx(auVar45,auVar56);
  auVar56 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar47,1);
  auVar47._8_4_ = 4;
  auVar47._0_8_ = 0x400000004;
  auVar47._12_4_ = 4;
  auVar56 = vandps_avx(auVar56,auVar47);
  auVar43 = vpor_avx(auVar35 ^ auVar43,auVar56);
  local_2690 = vpor_avx(auVar43,auVar45);
  local_25b0 = *(float *)ray;
  fStack_25ac = *(float *)(ray + 4);
  fStack_25a8 = *(float *)(ray + 8);
  fStack_25a4 = *(float *)(ray + 0xc);
  local_26a0 = local_2580._0_4_ * -*(float *)ray;
  fStack_269c = local_2580._4_4_ * -*(float *)(ray + 4);
  fStack_2698 = local_2580._8_4_ * -*(float *)(ray + 8);
  fStack_2694 = local_2580._12_4_ * -*(float *)(ray + 0xc);
  local_25c0 = *(float *)(ray + 0x10);
  fStack_25bc = *(float *)(ray + 0x14);
  fStack_25b8 = *(float *)(ray + 0x18);
  fStack_25b4 = *(float *)(ray + 0x1c);
  local_26b0 = local_2590._0_4_ * -*(float *)(ray + 0x10);
  fStack_26ac = local_2590._4_4_ * -*(float *)(ray + 0x14);
  fStack_26a8 = local_2590._8_4_ * -*(float *)(ray + 0x18);
  fStack_26a4 = local_2590._12_4_ * -*(float *)(ray + 0x1c);
  local_25d0 = *(float *)(ray + 0x20);
  fStack_25cc = *(float *)(ray + 0x24);
  fStack_25c8 = *(float *)(ray + 0x28);
  fStack_25c4 = *(float *)(ray + 0x2c);
  local_26c0 = local_25a0._0_4_ * -*(float *)(ray + 0x20);
  fStack_26bc = local_25a0._4_4_ * -*(float *)(ray + 0x24);
  fStack_26b8 = local_25a0._8_4_ * -*(float *)(ray + 0x28);
  fStack_26b4 = local_25a0._12_4_ * -*(float *)(ray + 0x2c);
  auVar63 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  local_2560 = 0x80000000;
  uStack_255c = 0x80000000;
  uStack_2558 = 0x80000000;
  uStack_2554 = 0x80000000;
  uStack_2550 = 0x80000000;
  uStack_254c = 0x80000000;
  uStack_2548 = 0x80000000;
  uStack_2544 = 0x80000000;
  local_2600 = 0x7f800000;
  uStack_25fc = 0x7f800000;
  uStack_25f8 = 0x7f800000;
  uStack_25f4 = 0x7f800000;
  local_26f8 = ray;
  local_26f0 = context;
LAB_00675d5a:
  lVar9 = 0;
  for (uVar28 = local_2700; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar9 = lVar9 + 1;
  }
  uVar24 = *(undefined4 *)(local_2690 + lVar9 * 4);
  auVar35._4_4_ = uVar24;
  auVar35._0_4_ = uVar24;
  auVar35._8_4_ = uVar24;
  auVar35._12_4_ = uVar24;
  auVar34 = vpcmpeqd_avx(auVar35,local_2690);
  uVar24 = vmovmskps_avx(auVar34);
  local_2700 = ~CONCAT44((int)((ulong)lVar9 >> 0x20),uVar24) & local_2700;
  auVar50 = auVar63._0_16_;
  auVar43 = vblendvps_avx(auVar50,auVar60._0_16_,auVar34);
  auVar35 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar35 = vminps_avx(auVar35,auVar43);
  auVar56 = vshufpd_avx(auVar35,auVar35,1);
  auVar43 = vblendvps_avx(auVar50,auVar61._0_16_,auVar34);
  auVar35 = vminps_avx(auVar56,auVar35);
  auVar56 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vminps_avx(auVar56,auVar43);
  auVar56 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vminps_avx(auVar56,auVar43);
  auVar35 = vinsertps_avx(auVar35,auVar43,0x1c);
  auVar43 = vblendvps_avx(auVar50,auVar62._0_16_,auVar34);
  auVar56 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vminps_avx(auVar56,auVar43);
  auVar56 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vminps_avx(auVar56,auVar43);
  auVar52 = vinsertps_avx(auVar35,auVar43,0x20);
  auVar41._8_4_ = 0xff800000;
  auVar41._0_8_ = 0xff800000ff800000;
  auVar41._12_4_ = 0xff800000;
  auVar43 = vblendvps_avx(auVar41,auVar60._0_16_,auVar34);
  auVar35 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar35 = vmaxps_avx(auVar35,auVar43);
  auVar56 = vshufpd_avx(auVar35,auVar35,1);
  auVar43 = vblendvps_avx(auVar41,auVar61._0_16_,auVar34);
  auVar35 = vmaxps_avx(auVar56,auVar35);
  auVar56 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vmaxps_avx(auVar56,auVar43);
  auVar56 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vmaxps_avx(auVar56,auVar43);
  auVar35 = vinsertps_avx(auVar35,auVar43,0x1c);
  auVar43 = vblendvps_avx(auVar41,auVar62._0_16_,auVar34);
  auVar56 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vmaxps_avx(auVar56,auVar43);
  auVar56 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vmaxps_avx(auVar56,auVar43);
  auVar44 = vinsertps_avx(auVar35,auVar43,0x20);
  auVar47 = vcmpps_avx(auVar52,_DAT_01feba10,5);
  auVar43 = vblendvps_avx(auVar44,auVar52,auVar47);
  auVar51 = vmovshdup_avx(auVar43);
  local_26c8 = (ulong)(auVar51._0_4_ < 0.0) << 5 | 0x40;
  auVar35 = vshufpd_avx(auVar43,auVar43,1);
  uVar32 = (ulong)(auVar35._0_4_ < 0.0) << 5 | 0x80;
  local_26d0 = local_26c8 ^ 0x20;
  local_23c0 = auVar43._0_4_;
  auVar10._4_4_ = fStack_25ac;
  auVar10._0_4_ = local_25b0;
  auVar10._8_4_ = fStack_25a8;
  auVar10._12_4_ = fStack_25a4;
  auVar35 = vblendvps_avx(auVar50,auVar10,auVar34);
  auVar56 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vminps_avx(auVar56,auVar35);
  auVar56 = vshufpd_avx(auVar35,auVar35,1);
  auVar56 = vminps_avx(auVar56,auVar35);
  auVar5._4_4_ = fStack_25bc;
  auVar5._0_4_ = local_25c0;
  auVar5._8_4_ = fStack_25b8;
  auVar5._12_4_ = fStack_25b4;
  auVar35 = vblendvps_avx(auVar50,auVar5,auVar34);
  auVar45 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vminps_avx(auVar45,auVar35);
  auVar45 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vminps_avx(auVar45,auVar35);
  auVar56 = vinsertps_avx(auVar56,auVar35,0x1c);
  auVar4._4_4_ = fStack_25cc;
  auVar4._0_4_ = local_25d0;
  auVar4._8_4_ = fStack_25c8;
  auVar4._12_4_ = fStack_25c4;
  auVar35 = vblendvps_avx(auVar50,auVar4,auVar34);
  auVar45 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vminps_avx(auVar45,auVar35);
  auVar45 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vminps_avx(auVar45,auVar35);
  auVar56 = vinsertps_avx(auVar56,auVar35,0x20);
  auVar35 = vblendvps_avx(auVar41,auVar10,auVar34);
  auVar45 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vmaxps_avx(auVar45,auVar35);
  auVar45 = vshufpd_avx(auVar35,auVar35,1);
  auVar45 = vmaxps_avx(auVar45,auVar35);
  auVar35 = vblendvps_avx(auVar41,auVar5,auVar34);
  auVar50 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vmaxps_avx(auVar50,auVar35);
  auVar50 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vmaxps_avx(auVar50,auVar35);
  auVar45 = vinsertps_avx(auVar45,auVar35,0x1c);
  auVar35 = vblendvps_avx(auVar41,auVar4,auVar34);
  auVar50 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vmaxps_avx(auVar50,auVar35);
  auVar50 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vmaxps_avx(auVar50,auVar35);
  auVar45 = vinsertps_avx(auVar45,auVar35,0x20);
  auVar35 = vblendvps_avx(auVar45,auVar56,auVar47);
  auVar56 = vblendvps_avx(auVar56,auVar45,auVar47);
  local_2730 = vblendvps_avx(auVar41,local_25f0,auVar34);
  auVar45 = vshufps_avx(local_2730,local_2730,0xb1);
  auVar50 = vmaxps_avx(auVar45,local_2730);
  auVar4 = vshufpd_avx(auVar50,auVar50,1);
  auVar55._8_4_ = 0x7f800000;
  auVar55._0_8_ = 0x7f8000007f800000;
  auVar55._12_4_ = 0x7f800000;
  auVar45 = vblendvps_avx(auVar55,local_25e0,auVar34);
  auVar5 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar45 = vminps_avx(auVar5,auVar45);
  auVar5 = vshufpd_avx(auVar45,auVar45,1);
  auVar45 = vminps_avx(auVar5,auVar45);
  local_2620 = auVar45._0_4_;
  auVar59 = ZEXT1664(CONCAT412(fStack_2694,CONCAT48(fStack_2698,CONCAT44(fStack_269c,local_26a0))));
  auVar50 = vmaxss_avx(auVar4,auVar50);
  auVar58 = ZEXT1664(CONCAT412(fStack_26b4,CONCAT48(fStack_26b8,CONCAT44(fStack_26bc,local_26c0))));
  auVar45 = vblendvps_avx(auVar52,auVar44,auVar47);
  auVar48._0_4_ = auVar56._0_4_ * local_23c0;
  auVar48._4_4_ = auVar56._4_4_ * auVar43._4_4_;
  auVar48._8_4_ = auVar56._8_4_ * auVar43._8_4_;
  auVar48._12_4_ = auVar56._12_4_ * auVar43._12_4_;
  auVar57 = ZEXT1664(CONCAT412(fStack_26a4,CONCAT48(fStack_26a8,CONCAT44(fStack_26ac,local_26b0))));
  local_2480 = auVar45._0_4_;
  auVar56._0_4_ = auVar35._0_4_ * local_2480;
  auVar56._4_4_ = auVar35._4_4_ * auVar45._4_4_;
  auVar56._8_4_ = auVar35._8_4_ * auVar45._8_4_;
  auVar56._12_4_ = auVar35._12_4_ * auVar45._12_4_;
  local_26d8 = (ulong)(local_23c0 < 0.0) << 5;
  uVar28 = local_26d8 ^ 0x20;
  local_23a0 = *(ulong *)&local_2708[1].bounds.bounds0.lower.field_0;
  local_2398[0] = 0;
  fStack_23bc = local_23c0;
  fStack_23b8 = local_23c0;
  fStack_23b4 = local_23c0;
  fStack_23b0 = local_23c0;
  fStack_23ac = local_23c0;
  fStack_23a8 = local_23c0;
  fStack_23a4 = local_23c0;
  local_23e0 = (uint)auVar48._0_4_ ^ local_2560;
  uStack_23dc = (uint)auVar48._0_4_ ^ uStack_255c;
  uStack_23d8 = (uint)auVar48._0_4_ ^ uStack_2558;
  uStack_23d4 = (uint)auVar48._0_4_ ^ uStack_2554;
  uStack_23d0 = (uint)auVar48._0_4_ ^ uStack_2550;
  uStack_23cc = (uint)auVar48._0_4_ ^ uStack_254c;
  uStack_23c8 = (uint)auVar48._0_4_ ^ uStack_2548;
  uStack_23c4 = (uint)auVar48._0_4_ ^ uStack_2544;
  local_2400 = auVar51._0_8_;
  uStack_23f8 = local_2400;
  uStack_23f0 = local_2400;
  uStack_23e8 = local_2400;
  auVar35 = vmovshdup_avx(auVar48);
  uVar23 = auVar35._0_4_;
  uVar40 = auVar35._4_4_;
  local_2420 = uVar23 ^ local_2560;
  uStack_241c = uVar40 ^ uStack_255c;
  uStack_2418 = uVar23 ^ uStack_2558;
  uStack_2414 = uVar40 ^ uStack_2554;
  uStack_2410 = uVar23 ^ uStack_2550;
  uStack_240c = uVar40 ^ uStack_254c;
  uStack_2408 = uVar23 ^ uStack_2548;
  uStack_2404 = uVar40 ^ uStack_2544;
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  local_2440 = auVar43._0_8_;
  uStack_2438 = local_2440;
  uStack_2430 = local_2440;
  uStack_2428 = local_2440;
  auVar43 = vshufps_avx(auVar48,auVar48,0xaa);
  uVar23 = auVar43._0_4_;
  uVar40 = auVar43._4_4_;
  local_2460 = uVar23 ^ local_2560;
  uStack_245c = uVar40 ^ uStack_255c;
  uStack_2458 = uVar23 ^ uStack_2558;
  uStack_2454 = uVar40 ^ uStack_2554;
  uStack_2450 = uVar23 ^ uStack_2550;
  uStack_244c = uVar40 ^ uStack_254c;
  uStack_2448 = uVar23 ^ uStack_2548;
  uStack_2444 = uVar40 ^ uStack_2544;
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  local_24a0 = (uint)auVar56._0_4_ ^ local_2560;
  uStack_249c = (uint)auVar56._0_4_ ^ uStack_255c;
  uStack_2498 = (uint)auVar56._0_4_ ^ uStack_2558;
  uStack_2494 = (uint)auVar56._0_4_ ^ uStack_2554;
  uStack_2490 = (uint)auVar56._0_4_ ^ uStack_2550;
  uStack_248c = (uint)auVar56._0_4_ ^ uStack_254c;
  uStack_2488 = (uint)auVar56._0_4_ ^ uStack_2548;
  uStack_2484 = (uint)auVar56._0_4_ ^ uStack_2544;
  auVar43 = vmovshdup_avx(auVar45);
  local_24c0 = auVar43._0_8_;
  uStack_24b8 = local_24c0;
  uStack_24b0 = local_24c0;
  uStack_24a8 = local_24c0;
  auVar43 = vmovshdup_avx(auVar56);
  uVar23 = auVar43._0_4_;
  uVar40 = auVar43._4_4_;
  local_24e0 = uVar23 ^ local_2560;
  uStack_24dc = uVar40 ^ uStack_255c;
  uStack_24d8 = uVar23 ^ uStack_2558;
  uStack_24d4 = uVar40 ^ uStack_2554;
  uStack_24d0 = uVar23 ^ uStack_2550;
  uStack_24cc = uVar40 ^ uStack_254c;
  uStack_24c8 = uVar23 ^ uStack_2548;
  uStack_24c4 = uVar40 ^ uStack_2544;
  auVar43 = vshufps_avx(auVar45,auVar45,0xaa);
  local_2500 = auVar43._0_8_;
  uStack_24f8 = local_2500;
  uStack_24f0 = local_2500;
  uStack_24e8 = local_2500;
  auVar43 = vshufps_avx(auVar56,auVar56,0xaa);
  uVar23 = auVar43._0_4_;
  uVar40 = auVar43._4_4_;
  local_2520 = uVar23 ^ local_2560;
  uStack_251c = uVar40 ^ uStack_255c;
  uStack_2518 = uVar23 ^ uStack_2558;
  uStack_2514 = uVar40 ^ uStack_2554;
  uStack_2510 = uVar23 ^ uStack_2550;
  uStack_250c = uVar40 ^ uStack_254c;
  uStack_2508 = uVar23 ^ uStack_2548;
  uStack_2504 = uVar40 ^ uStack_2544;
  local_2540 = local_2620;
  uStack_253c = local_2620;
  uStack_2538 = local_2620;
  uStack_2534 = local_2620;
  uStack_2530 = local_2620;
  uStack_252c = local_2620;
  uStack_2528 = local_2620;
  uStack_2524 = local_2620;
  auVar43._4_4_ = uStack_25fc;
  auVar43._0_4_ = local_2600;
  auVar43._8_4_ = uStack_25f8;
  auVar43._12_4_ = uStack_25f4;
  local_2720 = vblendvps_avx(auVar43,local_25e0,auVar34);
  auVar63 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  puVar31 = local_2390;
  do {
    local_2620 = auVar50._0_4_;
    uStack_261c = local_2620;
    uStack_2618 = local_2620;
    uStack_2614 = local_2620;
    uStack_2610 = local_2620;
    uStack_260c = local_2620;
    uStack_2608 = local_2620;
    uStack_2604 = local_2620;
LAB_0067614d:
    do {
      do {
        if (puVar31 == &local_23a0) {
          if (local_2700 == 0) {
            return;
          }
          goto LAB_00675d5a;
        }
        uVar24 = (undefined4)puVar31[-1];
        auVar34._4_4_ = uVar24;
        auVar34._0_4_ = uVar24;
        auVar34._8_4_ = uVar24;
        auVar34._12_4_ = uVar24;
        auVar37 = ZEXT1664(auVar34);
        puVar31 = puVar31 + -2;
        auVar43 = vcmpps_avx(auVar34,local_2730,1);
      } while ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar43[0xf]);
      uVar33 = *puVar31;
      while ((uVar33 & 8) == 0) {
        auVar20._4_4_ = uStack_23dc;
        auVar20._0_4_ = local_23e0;
        auVar20._8_4_ = uStack_23d8;
        auVar20._12_4_ = uStack_23d4;
        auVar20._16_4_ = uStack_23d0;
        auVar20._20_4_ = uStack_23cc;
        auVar20._24_4_ = uStack_23c8;
        auVar20._28_4_ = uStack_23c4;
        auVar21._4_4_ = fStack_23bc;
        auVar21._0_4_ = local_23c0;
        auVar21._8_4_ = fStack_23b8;
        auVar21._12_4_ = fStack_23b4;
        auVar21._16_4_ = fStack_23b0;
        auVar21._20_4_ = fStack_23ac;
        auVar21._24_4_ = fStack_23a8;
        auVar21._28_4_ = fStack_23a4;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar33 + 0x40 + local_26d8),auVar20,auVar21
                                 );
        auVar6._4_4_ = uStack_241c;
        auVar6._0_4_ = local_2420;
        auVar6._8_4_ = uStack_2418;
        auVar6._12_4_ = uStack_2414;
        auVar6._16_4_ = uStack_2410;
        auVar6._20_4_ = uStack_240c;
        auVar6._24_4_ = uStack_2408;
        auVar6._28_4_ = uStack_2404;
        auVar19._8_8_ = uStack_23f8;
        auVar19._0_8_ = local_2400;
        auVar19._16_8_ = uStack_23f0;
        auVar19._24_8_ = uStack_23e8;
        auVar35 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar33 + 0x40 + local_26c8),auVar6,auVar19)
        ;
        auVar6 = vpmaxsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar35));
        auVar17._4_4_ = uStack_245c;
        auVar17._0_4_ = local_2460;
        auVar17._8_4_ = uStack_2458;
        auVar17._12_4_ = uStack_2454;
        auVar17._16_4_ = uStack_2450;
        auVar17._20_4_ = uStack_244c;
        auVar17._24_4_ = uStack_2448;
        auVar17._28_4_ = uStack_2444;
        auVar18._8_8_ = uStack_2438;
        auVar18._0_8_ = local_2440;
        auVar18._16_8_ = uStack_2430;
        auVar18._24_8_ = uStack_2428;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar32),auVar17,auVar18);
        auVar7._4_4_ = uStack_253c;
        auVar7._0_4_ = local_2540;
        auVar7._8_4_ = uStack_2538;
        auVar7._12_4_ = uStack_2534;
        auVar7._16_4_ = uStack_2530;
        auVar7._20_4_ = uStack_252c;
        auVar7._24_4_ = uStack_2528;
        auVar7._28_4_ = uStack_2524;
        auVar7 = vpmaxsd_avx2(ZEXT1632(auVar43),auVar7);
        auVar6 = vpmaxsd_avx2(auVar6,auVar7);
        auVar15._4_4_ = uStack_249c;
        auVar15._0_4_ = local_24a0;
        auVar15._8_4_ = uStack_2498;
        auVar15._12_4_ = uStack_2494;
        auVar15._16_4_ = uStack_2490;
        auVar15._20_4_ = uStack_248c;
        auVar15._24_4_ = uStack_2488;
        auVar15._28_4_ = uStack_2484;
        auVar16._4_4_ = fStack_247c;
        auVar16._0_4_ = local_2480;
        auVar16._8_4_ = fStack_2478;
        auVar16._12_4_ = fStack_2474;
        auVar16._16_4_ = fStack_2470;
        auVar16._20_4_ = fStack_246c;
        auVar16._24_4_ = fStack_2468;
        auVar16._28_4_ = fStack_2464;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar28),auVar15,auVar16);
        auVar13._4_4_ = uStack_24dc;
        auVar13._0_4_ = local_24e0;
        auVar13._8_4_ = uStack_24d8;
        auVar13._12_4_ = uStack_24d4;
        auVar13._16_4_ = uStack_24d0;
        auVar13._20_4_ = uStack_24cc;
        auVar13._24_4_ = uStack_24c8;
        auVar13._28_4_ = uStack_24c4;
        auVar14._8_8_ = uStack_24b8;
        auVar14._0_8_ = local_24c0;
        auVar14._16_8_ = uStack_24b0;
        auVar14._24_8_ = uStack_24a8;
        auVar35 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar33 + 0x40 + local_26d0),auVar13,auVar14
                                 );
        auVar7 = vpminsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar35));
        auVar11._4_4_ = uStack_251c;
        auVar11._0_4_ = local_2520;
        auVar11._8_4_ = uStack_2518;
        auVar11._12_4_ = uStack_2514;
        auVar11._16_4_ = uStack_2510;
        auVar11._20_4_ = uStack_250c;
        auVar11._24_4_ = uStack_2508;
        auVar11._28_4_ = uStack_2504;
        auVar12._8_8_ = uStack_24f8;
        auVar12._0_8_ = local_2500;
        auVar12._16_8_ = uStack_24f0;
        auVar12._24_8_ = uStack_24e8;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar32 ^ 0x20)),auVar11,
                                  auVar12);
        auVar8._4_4_ = uStack_261c;
        auVar8._0_4_ = local_2620;
        auVar8._8_4_ = uStack_2618;
        auVar8._12_4_ = uStack_2614;
        auVar8._16_4_ = uStack_2610;
        auVar8._20_4_ = uStack_260c;
        auVar8._24_4_ = uStack_2608;
        auVar8._28_4_ = uStack_2604;
        auVar8 = vpminsd_avx2(ZEXT1632(auVar43),auVar8);
        auVar7 = vpminsd_avx2(auVar7,auVar8);
        local_2680.valid = (int *)auVar6._0_8_;
        local_2680.geometryUserPtr = (void *)auVar6._8_8_;
        local_2680.primID = auVar6._16_4_;
        local_2680._20_4_ = auVar6._20_4_;
        local_2680.context = (RTCRayQueryContext *)auVar6._24_8_;
        auVar6 = vcmpps_avx(auVar6,auVar7,2);
        uVar23 = vmovmskps_avx(auVar6);
        if (uVar23 == 0) {
          bVar22 = false;
          uVar26 = uVar33;
        }
        else {
          uVar29 = (ulong)(uVar23 & 0xff);
          auVar37 = ZEXT1664(auVar63._0_16_);
          uVar30 = 0;
          uVar25 = 8;
          do {
            lVar9 = 0;
            for (uVar26 = uVar29; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              lVar9 = lVar9 + 1;
            }
            uVar24 = *(undefined4 *)(uVar33 + 0x40 + lVar9 * 4);
            auVar38._4_4_ = uVar24;
            auVar38._0_4_ = uVar24;
            auVar38._8_4_ = uVar24;
            auVar38._12_4_ = uVar24;
            auVar56 = vfmadd213ps_fma(auVar38,auVar60._0_16_,auVar59._0_16_);
            uVar24 = *(undefined4 *)(uVar33 + 0x80 + lVar9 * 4);
            auVar42._4_4_ = uVar24;
            auVar42._0_4_ = uVar24;
            auVar42._8_4_ = uVar24;
            auVar42._12_4_ = uVar24;
            auVar45 = vfmadd213ps_fma(auVar42,auVar61._0_16_,auVar57._0_16_);
            uVar24 = *(undefined4 *)(uVar33 + 0xc0 + lVar9 * 4);
            auVar46._4_4_ = uVar24;
            auVar46._0_4_ = uVar24;
            auVar46._8_4_ = uVar24;
            auVar46._12_4_ = uVar24;
            auVar47 = vfmadd213ps_fma(auVar46,auVar62._0_16_,auVar58._0_16_);
            uVar24 = *(undefined4 *)(uVar33 + 0x60 + lVar9 * 4);
            auVar49._4_4_ = uVar24;
            auVar49._0_4_ = uVar24;
            auVar49._8_4_ = uVar24;
            auVar49._12_4_ = uVar24;
            auVar52 = vfmadd213ps_fma(auVar49,auVar60._0_16_,auVar59._0_16_);
            uVar24 = *(undefined4 *)(uVar33 + 0xa0 + lVar9 * 4);
            auVar53._4_4_ = uVar24;
            auVar53._0_4_ = uVar24;
            auVar53._8_4_ = uVar24;
            auVar53._12_4_ = uVar24;
            auVar44 = vfmadd213ps_fma(auVar53,auVar61._0_16_,auVar57._0_16_);
            uVar24 = *(undefined4 *)(uVar33 + 0xe0 + lVar9 * 4);
            auVar54._4_4_ = uVar24;
            auVar54._0_4_ = uVar24;
            auVar54._8_4_ = uVar24;
            auVar54._12_4_ = uVar24;
            auVar50 = vfmadd213ps_fma(auVar54,auVar62._0_16_,auVar58._0_16_);
            auVar43 = vpminsd_avx(auVar56,auVar52);
            auVar35 = vpminsd_avx(auVar45,auVar44);
            auVar43 = vpmaxsd_avx(auVar43,auVar35);
            auVar35 = vpminsd_avx(auVar47,auVar50);
            auVar35 = vpmaxsd_avx(auVar35,local_2720);
            auVar43 = vpmaxsd_avx(auVar43,auVar35);
            auVar35 = vpmaxsd_avx(auVar56,auVar52);
            auVar56 = vpmaxsd_avx(auVar45,auVar44);
            auVar56 = vpminsd_avx(auVar35,auVar56);
            auVar35 = vpmaxsd_avx(auVar47,auVar50);
            auVar35 = vpminsd_avx(auVar35,local_2730);
            auVar35 = vpminsd_avx(auVar56,auVar35);
            auVar43 = vcmpps_avx(auVar43,auVar35,2);
            uVar26 = uVar25;
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              uVar24 = *(undefined4 *)((long)&local_2680.valid + lVar9 * 4);
              auVar39._4_4_ = uVar24;
              auVar39._0_4_ = uVar24;
              auVar39._8_4_ = uVar24;
              auVar39._12_4_ = uVar24;
              uVar26 = *(ulong *)(uVar33 + lVar9 * 8);
              auVar35 = auVar37._0_16_;
              auVar43 = vcmpps_avx(auVar39,auVar35,1);
              if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar43[0xf]) {
                *puVar31 = uVar26;
                uVar26 = uVar25;
              }
              else {
                if (uVar25 == 8) {
                  auVar37 = ZEXT1664(auVar39);
                  goto LAB_00676378;
                }
                *puVar31 = uVar25;
                auVar37 = ZEXT1664(auVar39);
                auVar39 = auVar35;
              }
              uVar30 = uVar30 + 1;
              *(int *)(puVar31 + 1) = auVar39._0_4_;
              puVar31 = puVar31 + 2;
            }
LAB_00676378:
            uVar29 = uVar29 - 1 & uVar29;
            uVar25 = uVar26;
          } while (uVar29 != 0);
          if (uVar26 == 8) {
            bVar22 = false;
          }
          else {
            bVar22 = true;
            if (1 < uVar30) {
              puVar1 = puVar31 + -4;
              puVar2 = puVar31 + -2;
              if ((uint)puVar31[-3] < (uint)puVar31[-1]) {
                uVar33 = *puVar1;
                uVar25 = puVar31[-3];
                *(int *)(puVar31 + -3) = (int)puVar31[-1];
                *puVar1 = *puVar2;
                *puVar2 = uVar33;
                local_2740._8_4_ = (undefined4)uVar25;
                *(undefined4 *)(puVar31 + -1) = local_2740._8_4_;
              }
              if (uVar30 != 2) {
                puVar3 = puVar31 + -6;
                if ((uint)puVar31[-5] < (uint)puVar31[-1]) {
                  uVar33 = *puVar3;
                  uVar25 = puVar31[-5];
                  *(int *)(puVar31 + -5) = (int)puVar31[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = uVar33;
                  local_2740._8_4_ = (undefined4)uVar25;
                  *(undefined4 *)(puVar31 + -1) = local_2740._8_4_;
                }
                if ((uint)puVar31[-5] < (uint)puVar31[-3]) {
                  uVar33 = *puVar3;
                  uVar25 = puVar31[-5];
                  *(int *)(puVar31 + -5) = (int)puVar31[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = uVar33;
                  local_2740._8_4_ = (undefined4)uVar25;
                  *(undefined4 *)(puVar31 + -3) = local_2740._8_4_;
                }
              }
            }
          }
        }
        uVar33 = uVar26;
        if (!bVar22) goto LAB_0067614d;
      }
      auVar43 = vcmpps_avx(local_2730,auVar37._0_16_,6);
      auVar37 = ZEXT1664(auVar43);
      if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar43[0xf])
      goto LAB_0067614d;
      local_26e8 = (ulong)((uint)uVar33 & 0xf) - 8;
      if (local_26e8 != 0) {
        local_26e0 = 0;
        local_2570 = auVar43;
        do {
          local_2680.geomID = *(uint *)((uVar33 & 0xfffffffffffffff0) + local_26e0 * 8);
          local_2650 = (context->scene->geometries).items[local_2680.geomID].ptr;
          uVar23 = local_2650->mask;
          auVar36._4_4_ = uVar23;
          auVar36._0_4_ = uVar23;
          auVar36._8_4_ = uVar23;
          auVar36._12_4_ = uVar23;
          auVar43 = vpand_avx(auVar36,*(undefined1 (*) [16])(ray + 0x90));
          auVar43 = vpcmpeqd_avx(auVar43,_DAT_01feba10);
          auVar35 = auVar37._0_16_ & ~auVar43;
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') {
            local_2740 = vandnps_avx(auVar43,auVar37._0_16_);
            local_2680.geometryUserPtr = local_2650->userPtr;
            local_2680.valid = (int *)local_2740;
            auVar43 = (undefined1  [16])local_2680._0_16_;
            local_2680.context = context->user;
            local_2680.N = 4;
            local_2680.primID = *(undefined4 *)((uVar33 & 0xfffffffffffffff0) + 4 + local_26e0 * 8);
            local_2680._0_20_ = CONCAT416(local_2680.primID,auVar43);
            local_2648 = 0;
            local_2640 = context->args;
            pp_Var27 = (_func_int **)local_2640->intersect;
            if (pp_Var27 == (_func_int **)0x0) {
              pp_Var27 = local_2650[1].super_RefCount._vptr_RefCount;
            }
            local_2680.rayhit = (RTCRayHitN *)ray;
            (*(code *)pp_Var27)(&local_2680);
            auVar60 = ZEXT1664(local_2580);
            auVar61 = ZEXT1664(local_2590);
            auVar62 = ZEXT1664(local_25a0);
            auVar59 = ZEXT1664(CONCAT412(fStack_2694,
                                         CONCAT48(fStack_2698,CONCAT44(fStack_269c,local_26a0))));
            auVar57 = ZEXT1664(CONCAT412(fStack_26a4,
                                         CONCAT48(fStack_26a8,CONCAT44(fStack_26ac,local_26b0))));
            auVar58 = ZEXT1664(CONCAT412(fStack_26b4,
                                         CONCAT48(fStack_26b8,CONCAT44(fStack_26bc,local_26c0))));
            auVar63 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar37 = ZEXT1664(local_2570);
            context = local_26f0;
            ray = local_26f8;
          }
          auVar43 = auVar37._0_16_;
          local_26e0 = local_26e0 + 1;
        } while (local_26e8 != local_26e0);
      }
      auVar35 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),local_2730,1);
      auVar35 = auVar43 & auVar35;
    } while ((((auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar35[0xf]);
    local_2730 = vblendvps_avx(local_2730,*(undefined1 (*) [16])(ray + 0x80),auVar43);
    auVar43 = vshufps_avx(local_2730,local_2730,0xb1);
    auVar43 = vmaxps_avx(auVar43,local_2730);
    auVar35 = vshufpd_avx(auVar43,auVar43,1);
    auVar50 = vmaxss_avx(auVar35,auVar43);
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }